

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_fmopl.cpp
# Opt level: O0

bool CalcRhythm(FM_WorkTable *wt,FM_OPL *OPL,float *buffer,int length)

{
  int iVar1;
  float fVar2;
  int local_28;
  float sample;
  int i;
  int length_local;
  float *buffer_local;
  FM_OPL *OPL_local;
  FM_WorkTable *wt_local;
  
  for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
    advance_lfo(wt,OPL);
    wt->output = 0;
    OPL_CALC_RH(wt,OPL->P_CH,OPL->noise_rng & 1);
    fVar2 = (float)wt->output / 10240.0;
    if ((OPL->IsStereo & 1U) == 0) {
      buffer[local_28] = fVar2 + buffer[local_28];
    }
    else {
      buffer[local_28 << 1] = fVar2 * 0.70710677 + buffer[local_28 << 1];
      iVar1 = local_28 * 2 + 1;
      buffer[iVar1] = fVar2 * 0.70710677 + buffer[iVar1];
    }
    advance(wt,OPL,6,8);
    advance_noise(OPL);
  }
  return true;
}

Assistant:

static bool CalcRhythm (FM_WorkTable *wt, FM_OPL *OPL, float *buffer, int length)
{
	int i;

	for (i = 0; i < length; ++i)
	{
		advance_lfo(wt, OPL);

		wt->output = 0;
		OPL_CALC_RH(wt, &OPL->P_CH[0], OPL->noise_rng & 1);
		/* [RH] Convert to floating point. */
		float sample = float(wt->output) / 10240;
		if (!OPL->IsStereo)
		{
			buffer[i] += sample;
		}
		else
		{
			// [RH] Always use center panning for rhythm.
			// The MIDI player doesn't use the rhythm section anyway.
			buffer[i*2] += sample * CENTER_PANNING_POWER;
			buffer[i*2+1] += sample * CENTER_PANNING_POWER;
		}

		advance(wt, OPL, 6, 8);
		advance_noise(OPL);
	}
	return true;
}